

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF_const&>
          (QMovableArrayOps<QRectF> *this,qsizetype i,QRectF *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QRectF *pQVar4;
  qreal *in_RDX;
  QArrayDataPointer<QRectF> *in_RSI;
  QArrayDataPointer<QRectF> *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QRectF tmp;
  QRectF *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar6;
  undefined2 in_stack_ffffffffffffff94;
  byte bVar7;
  Inserter local_50;
  qreal local_28;
  qreal local_20;
  qreal local_18;
  qreal local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QRectF>::needsDetach
                    ((QArrayDataPointer<QRectF> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QRectF> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QRectF>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QRectF>::end
                         ((QArrayDataPointer<QRectF> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      pQVar4->xp = *in_RDX;
      pQVar4->yp = in_RDX[1];
      pQVar4->w = in_RDX[2];
      pQVar4->h = in_RDX[3];
      in_RDI->size = in_RDI->size + 1;
      goto LAB_009ad6c8;
    }
    if ((in_RSI == (QArrayDataPointer<QRectF> *)0x0) &&
       (qVar3 = QArrayDataPointer<QRectF>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QRectF>::begin((QArrayDataPointer<QRectF> *)0x9ad543);
      pQVar4[-1].xp = *in_RDX;
      pQVar4[-1].yp = in_RDX[1];
      pQVar4[-1].w = in_RDX[2];
      pQVar4[-1].h = in_RDX[3];
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_009ad6c8;
    }
  }
  local_28 = *in_RDX;
  local_20 = in_RDX[1];
  local_18 = in_RDX[2];
  local_10 = in_RDX[3];
  bVar5 = in_RDI->size != 0;
  uVar6 = bVar5 && in_RSI == (QArrayDataPointer<QRectF> *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QArrayDataPointer<QRectF> *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QRectF>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
             (QRectF **)in_RDI,
             (QArrayDataPointer<QRectF> *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff94,uVar2))),
                       in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff80),
                       (qsizetype)in_stack_ffffffffffffff78);
    Inserter::insertOne((Inserter *)CONCAT17(uVar6,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    Inserter::~Inserter(&local_50);
  }
  else {
    pQVar4 = QArrayDataPointer<QRectF>::begin((QArrayDataPointer<QRectF> *)0x9ad650);
    pQVar4[-1].xp = local_28;
    pQVar4[-1].yp = local_20;
    pQVar4[-1].w = local_18;
    pQVar4[-1].h = local_10;
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
LAB_009ad6c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }